

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O0

void __thiscall QFileInfo::QFileInfo(QFileInfo *this,QString *path)

{
  QSharedDataPointer<QFileInfoPrivate> *in_RDI;
  QFileInfoPrivate *in_stack_ffffffffffffffc8;
  
  operator_new(0x1e8);
  QFileInfoPrivate::QFileInfoPrivate((QFileInfoPrivate *)this,path);
  QSharedDataPointer<QFileInfoPrivate>::QSharedDataPointer(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

QFileInfo::QFileInfo(const QString &path) : d_ptr(new QFileInfoPrivate(path))
{
}